

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_defer_event_cb(pa_mainloop_api *a,void *userdata)

{
  long in_RSI;
  size_t writable_size;
  cubeb_stream_conflict *stm;
  cubeb_stream_conflict *in_stack_00000068;
  size_t in_stack_00000070;
  void *in_stack_00000078;
  pa_stream *in_stack_00000080;
  
  if (*(int *)(in_RSI + 0x50) == 0) {
    (*cubeb_pa_stream_writable_size)(*(pa_stream **)(in_RSI + 0x10));
    trigger_user_callback(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

static void
pulse_defer_event_cb(pa_mainloop_api * a, void * userdata)
{
  (void)a;
  cubeb_stream * stm = userdata;
  if (stm->shutdown) {
    return;
  }
  size_t writable_size = WRAP(pa_stream_writable_size)(stm->output_stream);
  trigger_user_callback(stm->output_stream, NULL, writable_size, stm);
}